

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptRegExp::GetSetterBuiltIns
          (JavascriptRegExp *this,PropertyId propertyId,PropertyValueInfo *info,
          DescriptorFlags *result)

{
  ScriptContext *pSVar1;
  ThreadConfiguration *pTVar2;
  BOOL BVar3;
  DescriptorFlags DVar4;
  
  pSVar1 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  switch(propertyId) {
  case 0x1a1:
    goto switchD_00bb36c5_caseD_1a1;
  case 0x1a2:
    DVar4 = WritableData;
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    goto LAB_00bb371f;
  case 0x1a4:
    pTVar2 = (pSVar1->config).threadConfig;
    if (pTVar2->m_ES2018RegExDotAll != true) {
      return false;
    }
    if (pTVar2->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    propertyId = 0x1a4;
    break;
  case 0x1a6:
    pTVar2 = (pSVar1->config).threadConfig;
    if (pTVar2->m_ES6Unicode != true) {
      return false;
    }
    if (pTVar2->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    propertyId = 0x1a6;
    break;
  case 0x1a7:
    pTVar2 = (pSVar1->config).threadConfig;
    if (pTVar2->m_ES6RegExSticky != true) {
      return false;
    }
    if (pTVar2->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    propertyId = 0x1a7;
    break;
  default:
    if ((propertyId != 0x153) && (propertyId != 0x1e0)) {
      return false;
    }
  case 0x1a0:
  case 0x1a3:
  case 0x1a5:
    if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
switchD_00bb36c5_caseD_1a1:
      return false;
    }
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  BVar3 = IsWritable(this,propertyId);
  DVar4 = (uint)(BVar3 != 0) * 4 + Data;
LAB_00bb371f:
  *result = DVar4;
  return true;
}

Assistant:

bool JavascriptRegExp::GetSetterBuiltIns(PropertyId propertyId, PropertyValueInfo* info, DescriptorFlags* result)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define GET_SETTER(ownProperty) \
        if (ownProperty) \
        { \
            PropertyValueInfo::SetNoCache(info, this); \
            *result = JavascriptRegExp::IsWritable(propertyId) ? WritableData : Data; \
            return true; \
        } \
        return false;

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            GET_SETTER(true);
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            GET_SETTER(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            GET_SETTER(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            GET_SETTER(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            GET_SETTER(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return false;
        }

#undef GET_SETTER
    }